

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_sps.c
# Opt level: O0

MPP_RET sps_mvc_extension(BitReadCtx_t *p_bitctx,H264_subSPS_t *subset_sps)

{
  MPP_RET MVar1;
  RK_S32 *pRVar2;
  RK_S32 **ppRVar3;
  RK_U32 local_58;
  RK_U32 local_54;
  RK_U32 _out_9;
  RK_U32 _out_8;
  RK_U32 _out_7;
  RK_U32 _out_6;
  RK_U32 _out_5;
  RK_U32 _out_4;
  RK_U32 _out_3;
  RK_U32 _out_2;
  RK_U32 _out_1;
  RK_U32 _out;
  RK_S32 num_views;
  RK_S32 j;
  RK_S32 i;
  MPP_RET ret;
  H264_subSPS_t *subset_sps_local;
  BitReadCtx_t *p_bitctx_local;
  
  j = -2;
  num_views = 0;
  _out = 0;
  _out_1 = 0;
  _i = subset_sps;
  subset_sps_local = (H264_subSPS_t *)p_bitctx;
  MVar1 = mpp_read_ue(p_bitctx,&_out_2);
  (subset_sps_local->sps).seq_scaling_list_present_flag[5] = MVar1;
  if ((subset_sps_local->sps).seq_scaling_list_present_flag[5] == 0) {
    _i->num_views_minus1 = _out_2;
    if (0xf < _i->num_views_minus1) {
      j = -6;
      if ((h264d_debug & 4) == 0) {
        return -6;
      }
      _mpp_log_l(4,"h264d_sps","value error(%d).\n",(char *)0x0,0x130);
      return j;
    }
    _out_1 = _i->num_views_minus1 + 1;
    if (0 < (int)_out_1) {
      pRVar2 = (RK_S32 *)mpp_osal_calloc("sps_mvc_extension",(long)(int)_out_1 << 2);
      _i->view_id = pRVar2;
      pRVar2 = (RK_S32 *)mpp_osal_calloc("sps_mvc_extension",(long)(int)_out_1 << 2);
      _i->num_anchor_refs_l0 = pRVar2;
      pRVar2 = (RK_S32 *)mpp_osal_calloc("sps_mvc_extension",(long)(int)_out_1 << 2);
      _i->num_anchor_refs_l1 = pRVar2;
      ppRVar3 = (RK_S32 **)mpp_osal_calloc("sps_mvc_extension",(long)(int)_out_1 << 3);
      _i->anchor_ref_l0 = ppRVar3;
      ppRVar3 = (RK_S32 **)mpp_osal_calloc("sps_mvc_extension",(long)(int)_out_1 << 3);
      _i->anchor_ref_l1 = ppRVar3;
      pRVar2 = (RK_S32 *)mpp_osal_calloc("sps_mvc_extension",(long)(int)_out_1 << 2);
      _i->num_non_anchor_refs_l0 = pRVar2;
      pRVar2 = (RK_S32 *)mpp_osal_calloc("sps_mvc_extension",(long)(int)_out_1 << 2);
      _i->num_non_anchor_refs_l1 = pRVar2;
      ppRVar3 = (RK_S32 **)mpp_osal_calloc("sps_mvc_extension",(long)(int)_out_1 << 3);
      _i->non_anchor_ref_l0 = ppRVar3;
      ppRVar3 = (RK_S32 **)mpp_osal_calloc("sps_mvc_extension",(long)(int)_out_1 << 3);
      _i->non_anchor_ref_l1 = ppRVar3;
      if ((((((_i->view_id == (RK_S32 *)0x0) || (_i->num_anchor_refs_l0 == (RK_S32 *)0x0)) ||
            (_i->num_anchor_refs_l1 == (RK_S32 *)0x0)) ||
           ((_i->anchor_ref_l0 == (RK_S32 **)0x0 || (_i->anchor_ref_l1 == (RK_S32 **)0x0)))) ||
          ((_i->num_non_anchor_refs_l0 == (RK_S32 *)0x0 ||
           ((_i->num_non_anchor_refs_l1 == (RK_S32 *)0x0 ||
            (_i->non_anchor_ref_l0 == (RK_S32 **)0x0)))))) ||
         (_i->non_anchor_ref_l1 == (RK_S32 **)0x0)) {
        j = -4;
        if ((h264d_debug & 1) != 0) {
          _mpp_log_l(4,"h264d_sps","malloc buffer error(%d).\n",(char *)0x0,0x141);
          return j;
        }
        return MPP_ERR_MALLOC;
      }
    }
    for (num_views = 0; num_views < (int)_out_1; num_views = num_views + 1) {
      MVar1 = mpp_read_ue((BitReadCtx_t *)subset_sps_local,&_out_3);
      (subset_sps_local->sps).seq_scaling_list_present_flag[5] = MVar1;
      if ((subset_sps_local->sps).seq_scaling_list_present_flag[5] != 0) goto LAB_001c28be;
      _i->view_id[num_views] = _out_3;
    }
    for (num_views = 1; num_views < (int)_out_1; num_views = num_views + 1) {
      MVar1 = mpp_read_ue((BitReadCtx_t *)subset_sps_local,&_out_4);
      (subset_sps_local->sps).seq_scaling_list_present_flag[5] = MVar1;
      if ((subset_sps_local->sps).seq_scaling_list_present_flag[5] != 0) goto LAB_001c28be;
      _i->num_anchor_refs_l0[num_views] = _out_4;
      if (_i->num_anchor_refs_l0[num_views] != 0) {
        pRVar2 = (RK_S32 *)
                 mpp_osal_calloc("sps_mvc_extension",(long)_i->num_anchor_refs_l0[num_views] << 2);
        _i->anchor_ref_l0[num_views] = pRVar2;
        if (_i->anchor_ref_l0[num_views] == (RK_S32 *)0x0) {
          j = -4;
          if ((h264d_debug & 1) != 0) {
            _mpp_log_l(4,"h264d_sps","malloc buffer error(%d).\n",(char *)0x0,0x14a);
            return j;
          }
          return MPP_ERR_MALLOC;
        }
        for (_out = 0; (int)_out < _i->num_anchor_refs_l0[num_views]; _out = _out + 1) {
          MVar1 = mpp_read_ue((BitReadCtx_t *)subset_sps_local,&_out_5);
          (subset_sps_local->sps).seq_scaling_list_present_flag[5] = MVar1;
          if ((subset_sps_local->sps).seq_scaling_list_present_flag[5] != 0) goto LAB_001c28be;
          _i->anchor_ref_l0[num_views][(int)_out] = _out_5;
        }
      }
      MVar1 = mpp_read_ue((BitReadCtx_t *)subset_sps_local,&_out_6);
      (subset_sps_local->sps).seq_scaling_list_present_flag[5] = MVar1;
      if ((subset_sps_local->sps).seq_scaling_list_present_flag[5] != 0) goto LAB_001c28be;
      _i->num_anchor_refs_l1[num_views] = _out_6;
      if (_i->num_anchor_refs_l1[num_views] != 0) {
        pRVar2 = (RK_S32 *)
                 mpp_osal_calloc("sps_mvc_extension",(long)_i->num_anchor_refs_l1[num_views] << 2);
        _i->anchor_ref_l1[num_views] = pRVar2;
        if (_i->anchor_ref_l1[num_views] == (RK_S32 *)0x0) {
          j = -4;
          if ((h264d_debug & 1) != 0) {
            _mpp_log_l(4,"h264d_sps","malloc buffer error(%d).\n",(char *)0x0,0x152);
            return j;
          }
          return MPP_ERR_MALLOC;
        }
        for (_out = 0; (int)_out < _i->num_anchor_refs_l1[num_views]; _out = _out + 1) {
          MVar1 = mpp_read_ue((BitReadCtx_t *)subset_sps_local,&_out_7);
          (subset_sps_local->sps).seq_scaling_list_present_flag[5] = MVar1;
          if ((subset_sps_local->sps).seq_scaling_list_present_flag[5] != 0) goto LAB_001c28be;
          _i->anchor_ref_l1[num_views][(int)_out] = _out_7;
        }
      }
    }
    num_views = 1;
    while( true ) {
      if ((int)_out_1 <= num_views) {
        return MPP_OK;
      }
      MVar1 = mpp_read_ue((BitReadCtx_t *)subset_sps_local,&_out_8);
      (subset_sps_local->sps).seq_scaling_list_present_flag[5] = MVar1;
      if ((subset_sps_local->sps).seq_scaling_list_present_flag[5] != 0) break;
      _i->num_non_anchor_refs_l0[num_views] = _out_8;
      if (_i->num_non_anchor_refs_l0[num_views] != 0) {
        pRVar2 = (RK_S32 *)
                 mpp_osal_calloc("sps_mvc_extension",
                                 (long)_i->num_non_anchor_refs_l0[num_views] << 2);
        _i->non_anchor_ref_l0[num_views] = pRVar2;
        if (_i->non_anchor_ref_l0[num_views] == (RK_S32 *)0x0) {
          j = -4;
          if ((h264d_debug & 1) != 0) {
            _mpp_log_l(4,"h264d_sps","malloc buffer error(%d).\n",(char *)0x0,0x15c);
            return j;
          }
          return MPP_ERR_MALLOC;
        }
        for (_out = 0; (int)_out < _i->num_non_anchor_refs_l0[num_views]; _out = _out + 1) {
          MVar1 = mpp_read_ue((BitReadCtx_t *)subset_sps_local,&_out_9);
          (subset_sps_local->sps).seq_scaling_list_present_flag[5] = MVar1;
          if ((subset_sps_local->sps).seq_scaling_list_present_flag[5] != 0) goto LAB_001c28be;
          _i->non_anchor_ref_l0[num_views][(int)_out] = _out_9;
        }
      }
      MVar1 = mpp_read_ue((BitReadCtx_t *)subset_sps_local,&local_54);
      (subset_sps_local->sps).seq_scaling_list_present_flag[5] = MVar1;
      if ((subset_sps_local->sps).seq_scaling_list_present_flag[5] != 0) break;
      _i->num_non_anchor_refs_l1[num_views] = local_54;
      if (_i->num_non_anchor_refs_l1[num_views] != 0) {
        pRVar2 = (RK_S32 *)
                 mpp_osal_calloc("sps_mvc_extension",
                                 (long)_i->num_non_anchor_refs_l1[num_views] << 2);
        _i->non_anchor_ref_l1[num_views] = pRVar2;
        if (_i->non_anchor_ref_l1[num_views] == (RK_S32 *)0x0) {
          j = -4;
          if ((h264d_debug & 1) != 0) {
            _mpp_log_l(4,"h264d_sps","malloc buffer error(%d).\n",(char *)0x0,0x164);
            return j;
          }
          return MPP_ERR_MALLOC;
        }
        for (_out = 0; (int)_out < _i->num_non_anchor_refs_l1[num_views]; _out = _out + 1) {
          MVar1 = mpp_read_ue((BitReadCtx_t *)subset_sps_local,&local_58);
          (subset_sps_local->sps).seq_scaling_list_present_flag[5] = MVar1;
          if ((subset_sps_local->sps).seq_scaling_list_present_flag[5] != 0) goto LAB_001c28be;
          _i->non_anchor_ref_l1[num_views][(int)_out] = local_58;
        }
      }
      num_views = num_views + 1;
    }
  }
LAB_001c28be:
  return (subset_sps_local->sps).seq_scaling_list_present_flag[5];
}

Assistant:

static MPP_RET sps_mvc_extension(BitReadCtx_t *p_bitctx, H264_subSPS_t *subset_sps)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    RK_S32 i = 0, j = 0, num_views = 0;

    READ_UE(p_bitctx, &subset_sps->num_views_minus1);
    VAL_CHECK(ret, subset_sps->num_views_minus1 < 16);
    num_views = 1 + subset_sps->num_views_minus1;
    //========================
    if (num_views > 0) {
        subset_sps->view_id                = mpp_calloc(RK_S32,  num_views);
        subset_sps->num_anchor_refs_l0     = mpp_calloc(RK_S32,  num_views);
        subset_sps->num_anchor_refs_l1     = mpp_calloc(RK_S32,  num_views);
        subset_sps->anchor_ref_l0          = mpp_calloc(RK_S32*, num_views);
        subset_sps->anchor_ref_l1          = mpp_calloc(RK_S32*, num_views);
        subset_sps->num_non_anchor_refs_l0 = mpp_calloc(RK_S32,  num_views);
        subset_sps->num_non_anchor_refs_l1 = mpp_calloc(RK_S32,  num_views);
        subset_sps->non_anchor_ref_l0      = mpp_calloc(RK_S32*, num_views);
        subset_sps->non_anchor_ref_l1      = mpp_calloc(RK_S32*, num_views);
        MEM_CHECK(ret, subset_sps->view_id        && subset_sps->num_anchor_refs_l0
                  && subset_sps->num_anchor_refs_l1     && subset_sps->anchor_ref_l0
                  && subset_sps->anchor_ref_l1          && subset_sps->num_non_anchor_refs_l0
                  && subset_sps->num_non_anchor_refs_l1 && subset_sps->non_anchor_ref_l0
                  && subset_sps->non_anchor_ref_l1);
    }
    for (i = 0; i < num_views; i++) {
        READ_UE(p_bitctx, &subset_sps->view_id[i]);
    }
    for (i = 1; i < num_views; i++) {
        READ_UE(p_bitctx, &subset_sps->num_anchor_refs_l0[i]);
        if (subset_sps->num_anchor_refs_l0[i]) {
            subset_sps->anchor_ref_l0[i] = mpp_calloc(RK_S32, subset_sps->num_anchor_refs_l0[i]);
            MEM_CHECK(ret, subset_sps->anchor_ref_l0[i]);
            for (j = 0; j < subset_sps->num_anchor_refs_l0[i]; j++) {
                READ_UE(p_bitctx, &subset_sps->anchor_ref_l0[i][j]);
            }
        }
        READ_UE(p_bitctx, &subset_sps->num_anchor_refs_l1[i]);
        if (subset_sps->num_anchor_refs_l1[i]) {
            subset_sps->anchor_ref_l1[i] = mpp_calloc(RK_S32, subset_sps->num_anchor_refs_l1[i]);
            MEM_CHECK(ret, subset_sps->anchor_ref_l1[i]);
            for (j = 0; j < subset_sps->num_anchor_refs_l1[i]; j++) {
                READ_UE(p_bitctx, &subset_sps->anchor_ref_l1[i][j]);
            }
        }
    }
    for (i = 1; i < num_views; i++) {
        READ_UE(p_bitctx, &subset_sps->num_non_anchor_refs_l0[i]);
        if (subset_sps->num_non_anchor_refs_l0[i]) {
            subset_sps->non_anchor_ref_l0[i] = mpp_calloc(RK_S32, subset_sps->num_non_anchor_refs_l0[i]);
            MEM_CHECK(ret, subset_sps->non_anchor_ref_l0[i]);
            for (j = 0; j < subset_sps->num_non_anchor_refs_l0[i]; j++) {
                READ_UE(p_bitctx, &subset_sps->non_anchor_ref_l0[i][j]);
            }
        }
        READ_UE(p_bitctx, &subset_sps->num_non_anchor_refs_l1[i]);
        if (subset_sps->num_non_anchor_refs_l1[i]) {
            subset_sps->non_anchor_ref_l1[i] = mpp_calloc(RK_S32, subset_sps->num_non_anchor_refs_l1[i]);
            MEM_CHECK(ret, subset_sps->non_anchor_ref_l1[i]);

            for (j = 0; j < subset_sps->num_non_anchor_refs_l1[i]; j++) {
                READ_UE(p_bitctx, &subset_sps->non_anchor_ref_l1[i][j]);
            }
        }
    }
    return ret = MPP_OK;
__BITREAD_ERR:
    ret = p_bitctx->ret;
__FAILED:
    return ret;
}